

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

uchar __thiscall
RegVmLoweredFunction::AllocateRegister
          (RegVmLoweredFunction *this,VmValue *value,uint index,bool freeDelayed)

{
  bool bVar1;
  uint uVar2;
  uchar *puVar3;
  SmallArray<unsigned_char,_8U> *this_00;
  uchar local_31;
  VmInstruction *local_30;
  VmInstruction *instruction;
  bool freeDelayed_local;
  VmValue *pVStack_20;
  uint index_local;
  VmValue *value_local;
  RegVmLoweredFunction *this_local;
  
  instruction._3_1_ = freeDelayed;
  instruction._4_4_ = index;
  pVStack_20 = value;
  value_local = (VmValue *)this;
  local_30 = getType<VmInstruction>(value);
  if ((instruction._3_1_ & 1) != 0) {
    FreeDelayedRegisters(this,(RegVmLoweredBlock *)0x0);
  }
  if (local_30 != (VmInstruction *)0x0) {
    bVar1 = SmallArray<VmValue_*,_8U>::empty(&(local_30->super_VmValue).users);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!instruction->users.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0xb2,
                    "unsigned char RegVmLoweredFunction::AllocateRegister(VmValue *, unsigned int, bool)"
                   );
    }
    if ((local_30->regVmAllocated & 1U) == 0) {
      uVar2 = SmallArray<unsigned_char,_8U>::size(&local_30->regVmRegisters);
      if (uVar2 != instruction._4_4_) {
        __assert_fail("instruction->regVmRegisters.size() == index",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0xb7,
                      "unsigned char RegVmLoweredFunction::AllocateRegister(VmValue *, unsigned int, bool)"
                     );
      }
      this_00 = &local_30->regVmRegisters;
      local_31 = GetRegister(this);
      SmallArray<unsigned_char,_8U>::push_back(this_00,&local_31);
      puVar3 = SmallArray<unsigned_char,_8U>::back(&local_30->regVmRegisters);
      this_local._7_1_ = *puVar3;
    }
    else {
      puVar3 = SmallArray<unsigned_char,_8U>::operator[]
                         (&local_30->regVmRegisters,instruction._4_4_);
      this_local._7_1_ = *puVar3;
    }
    return this_local._7_1_;
  }
  __assert_fail("instruction",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                ,0xb1,
                "unsigned char RegVmLoweredFunction::AllocateRegister(VmValue *, unsigned int, bool)"
               );
}

Assistant:

unsigned char RegVmLoweredFunction::AllocateRegister(VmValue *value, unsigned index, bool freeDelayed)
{
	VmInstruction *instruction = getType<VmInstruction>(value);

	if(freeDelayed)
		FreeDelayedRegisters(NULL);

	assert(instruction);
	assert(!instruction->users.empty());

	if(instruction->regVmAllocated)
		return instruction->regVmRegisters[index];

	assert(instruction->regVmRegisters.size() == index);

	instruction->regVmRegisters.push_back(GetRegister());

	return instruction->regVmRegisters.back();
}